

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O2

void HTS_mgc2mgc(HTS_Vocoder *v,double *c1,int m1,double a1,double g1,double *c2,int m2,double a2,
                double g2)

{
  if ((a1 != a2) || (NAN(a1) || NAN(a2))) {
    HTS_freqt(v,c1,m1,c2,m2,(a2 - a1) / (1.0 - a1 * a2));
    HTS_gnorm(c2,c2,m2,g1);
    c1 = c2;
    m1 = m2;
  }
  else {
    HTS_gnorm(c1,c1,m1,g1);
  }
  HTS_gc2gc(v,c1,m1,g1,c2,m2,g2);
  HTS_ignorm(c2,c2,m2,g2);
  return;
}

Assistant:

static void HTS_mgc2mgc(HTS_Vocoder * v, double *c1, const int m1, const double a1, const double g1, double *c2, const int m2, const double a2, const double g2)
{
   double a;

   if (a1 == a2) {
      HTS_gnorm(c1, c1, m1, g1);
      HTS_gc2gc(v, c1, m1, g1, c2, m2, g2);
      HTS_ignorm(c2, c2, m2, g2);
   } else {
      a = (a2 - a1) / (1 - a1 * a2);
      HTS_freqt(v, c1, m1, c2, m2, a);
      HTS_gnorm(c2, c2, m2, g1);
      HTS_gc2gc(v, c2, m2, g1, c2, m2, g2);
      HTS_ignorm(c2, c2, m2, g2);
   }
}